

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::UniformLocMixWithImplicitMax::Run(UniformLocMixWithImplicitMax *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  ulong uVar4;
  LayoutSpecifierBase LVar5;
  DefOccurence local_820;
  DefOccurence local_81c;
  LayoutSpecifierBase local_818;
  LayoutSpecifierBase local_808;
  UniformType local_7f8;
  Uniform local_768;
  LayoutSpecifierBase local_590;
  DefOccurence local_580;
  DefOccurence local_57c;
  LayoutSpecifierBase local_578;
  LayoutSpecifierBase local_568;
  UniformType local_558;
  Uniform local_4c8;
  LayoutSpecifierBase local_2f0;
  DefOccurence local_2e0;
  DefOccurence local_2dc;
  LayoutSpecifierBase local_2d8;
  LayoutSpecifierBase local_2c8;
  UniformType local_2b0;
  Uniform local_220;
  undefined1 local_48 [8];
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  int test;
  int tests [3];
  int implicitCount;
  GLint max;
  long ret;
  UniformLocMixWithImplicitMax *this_local;
  
  _implicitCount = 0;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x826e,tests + 2);
  tests[1] = 1;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  tests[0] = tests[2] + -1;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  do {
    if (2 < (int)uniforms.
                 super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      return _implicitCount;
    }
    std::
    vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              *)local_48);
    if (0 < *(int *)((long)&uniforms.
                            super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage +
                    (long)(int)uniforms.
                               super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage * 4 + 4)) {
      UniformType::UniformType
                (&local_2b0,0x1406,
                 *(int *)((long)&uniforms.
                                 super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage +
                         (long)(int)uniforms.
                                    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 4 + 4));
      LVar5 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(0,Dec);
      local_2d8 = LVar5;
      local_2c8 = LVar5;
      DefOccurence::DefOccurence(&local_2dc,ALL_SH);
      DefOccurence::DefOccurence(&local_2e0,NONE_SH);
      local_2f0 = local_2c8;
      anon_unknown_0::Uniform::Uniform
                (&local_220,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
                 &local_2b0,(Loc)local_2c8,local_2dc,local_2e0);
      std::
      vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   *)local_48,&local_220);
      anon_unknown_0::Uniform::~Uniform(&local_220);
      UniformType::~UniformType(&local_2b0);
      sVar2 = std::
              vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ::size((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_48);
      pvVar3 = std::
               vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               ::operator[]((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                             *)local_48,sVar2 - 1);
      iVar1 = (pvVar3->location).super_LayoutSpecifierBase.val;
      sVar2 = std::
              vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ::size((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_48);
      pvVar3 = std::
               vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               ::operator[]((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                             *)local_48,sVar2 - 1);
      if (iVar1 + (pvVar3->type).arraySize !=
          *(int *)((long)&uniforms.
                          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage +
                  (long)(int)uniforms.
                             super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage * 4 + 4)) {
        __assert_fail("uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize == tests[test]"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x98e,
                      "virtual long glcts::(anonymous namespace)::UniformLocMixWithImplicitMax::Run()"
                     );
      }
    }
    if (*(int *)((long)&uniforms.
                        super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage +
                (long)(int)uniforms.
                           super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage * 4 + 4) <
        tests[2] + -1) {
      UniformType::UniformType
                (&local_558,0x1406,
                 ~*(uint *)((long)&uniforms.
                                   super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage +
                           (long)(int)uniforms.
                                      super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage * 4 + 4) +
                 tests[2]);
      LVar5 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C
                        (*(int *)((long)&uniforms.
                                         super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                 (long)(int)uniforms.
                                            super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage * 4 +
                                 4) + 1,Dec);
      local_578 = LVar5;
      local_568 = LVar5;
      DefOccurence::DefOccurence(&local_57c,ALL_SH);
      DefOccurence::DefOccurence(&local_580,NONE_SH);
      local_590 = local_568;
      anon_unknown_0::Uniform::Uniform
                (&local_4c8,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
                 &local_558,(Loc)local_568,local_57c,local_580);
      std::
      vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   *)local_48,&local_4c8);
      anon_unknown_0::Uniform::~Uniform(&local_4c8);
      UniformType::~UniformType(&local_558);
      sVar2 = std::
              vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ::size((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_48);
      pvVar3 = std::
               vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               ::operator[]((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                             *)local_48,sVar2 - 1);
      iVar1 = (pvVar3->location).super_LayoutSpecifierBase.val;
      sVar2 = std::
              vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ::size((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_48);
      pvVar3 = std::
               vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               ::operator[]((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                             *)local_48,sVar2 - 1);
      if (iVar1 + (pvVar3->type).arraySize != tests[2]) {
        __assert_fail("uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize == max"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x998,
                      "virtual long glcts::(anonymous namespace)::UniformLocMixWithImplicitMax::Run()"
                     );
      }
    }
    UniformType::UniformType(&local_7f8,0x1406,0);
    LVar5 = (LayoutSpecifierBase)
            LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::Implicit();
    local_818 = LVar5;
    local_808 = LVar5;
    DefOccurence::DefOccurence(&local_81c,ALL_SH);
    DefOccurence::DefOccurence(&local_820,ALL_SH);
    anon_unknown_0::Uniform::Uniform
              (&local_768,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
               &local_7f8,(Loc)local_808,local_81c,local_820);
    std::
    vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                 *)local_48,&local_768);
    anon_unknown_0::Uniform::~Uniform(&local_768);
    UniformType::~UniformType(&local_7f8);
    uVar4 = ExplicitUniformLocationCaseBase::doRun
                      (&this->super_ExplicitUniformLocationCaseBase,
                       (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                        *)local_48);
    _implicitCount = uVar4 | _implicitCount;
    std::
    vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_48);
    uniforms.
    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)uniforms.
              super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  } while( true );
}

Assistant:

virtual long Run()
	{
		long ret = NO_ERROR;

		GLint max;
		glGetIntegerv(GL_MAX_UNIFORM_LOCATIONS, &max);

		const int implicitCount = 1;

		int tests[3] = { 0, 3, max - implicitCount };

		for (int test = 0; test < 3; test++)
		{
			std::vector<Uniform> uniforms;

			//for performance reasons fill-up all avaliable locations with an unused arrays.
			if (tests[test] > 0)
			{
				//[0..test - 1]
				uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, tests[test]), Loc::C(0),
										   DefOccurence::ALL_SH, DefOccurence::NONE_SH));
				assert(uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize ==
					   tests[test]);
			}

			if (tests[test] < max - implicitCount)
			{
				//[test + 1..max]
				uniforms.push_back(
					Uniform(uniformValueGenerator, UniformType(GL_FLOAT, max - implicitCount - tests[test]),
							Loc::C(tests[test] + implicitCount), DefOccurence::ALL_SH, DefOccurence::NONE_SH));
				assert(uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize ==
					   max);
			}

			uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::Implicit()));
			ret |= doRun(uniforms);
		}
		return ret;
	}